

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

RefPtr<wabt::interp::HostFunc> * __thiscall
wabt::interp::Store::
Alloc<wabt::interp::HostFunc,wabt::interp::Store&,wabt::interp::FuncType&,std::function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>&>
          (RefPtr<wabt::interp::HostFunc> *__return_storage_ptr__,Store *this,Store *args,
          FuncType *args_1,
          function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
          *args_2)

{
  HostFunc *pHVar1;
  Index index;
  function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
  local_a0;
  FuncType local_80;
  HostFunc *local_40;
  Ref local_38;
  Ref ref;
  function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
  *args_local_2;
  FuncType *args_local_1;
  Store *args_local;
  Store *this_local;
  RefPtr<wabt::interp::HostFunc> *ptr;
  
  ref.index = (size_t)args_2;
  pHVar1 = (HostFunc *)operator_new(0xa0);
  FuncType::FuncType(&local_80,args_1);
  std::
  function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
  ::function(&local_a0,
             (function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
              *)ref.index);
  HostFunc::HostFunc(pHVar1,args,&local_80,&local_a0);
  local_40 = pHVar1;
  index = FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
          ::New<wabt::interp::HostFunc*>
                    ((FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
                      *)&this->objects_,&local_40);
  Ref::Ref(&local_38,index);
  std::
  function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
  ::~function(&local_a0);
  FuncType::~FuncType(&local_80);
  RefPtr<wabt::interp::HostFunc>::RefPtr(__return_storage_ptr__,this,local_38);
  pHVar1 = RefPtr<wabt::interp::HostFunc>::operator->(__return_storage_ptr__);
  (pHVar1->super_Func).super_Extern.super_Object.self_.index = local_38.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}